

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compactor.cc
# Opt level: O0

void compactor_get_next_filename(char *file,char *nextfile)

{
  bool bVar1;
  int iVar2;
  char *in_RSI;
  char *in_RDI;
  char str_no [24];
  int prefix_len;
  int compaction_no;
  char *in_stack_00000060;
  char *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  int local_14;
  char *local_10;
  char *local_8;
  
  local_14 = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  iVar2 = _compactor_prefix_len(in_stack_ffffffffffffffd0);
  if ((iVar2 < 1) || (bVar1 = _allDigit(in_stack_ffffffffffffffc8), !bVar1)) {
    do {
      strcpy(local_10,local_8);
      local_14 = local_14 + 1;
      sprintf(&stack0xffffffffffffffc8,".%d");
      strcat(local_10,&stack0xffffffffffffffc8);
      bVar1 = does_file_exist(in_stack_00000060);
    } while (bVar1);
  }
  else {
    __isoc99_sscanf(local_8 + iVar2,"%d",&local_14);
    strncpy(local_10,local_8,(long)iVar2);
    do {
      local_10[iVar2] = '\0';
      local_14 = local_14 + 1;
      sprintf(&stack0xffffffffffffffc8,"%d");
      strcat(local_10,&stack0xffffffffffffffc8);
      bVar1 = does_file_exist(in_stack_00000060);
    } while (bVar1);
  }
  return;
}

Assistant:

void compactor_get_next_filename(char *file, char *nextfile)
{
    int compaction_no = 0;
    int prefix_len = _compactor_prefix_len(file);
    char str_no[24];

    if (prefix_len > 0 && _allDigit(file + prefix_len)) {
        sscanf(file+prefix_len, "%d", &compaction_no);
        strncpy(nextfile, file, prefix_len);
        do {
            nextfile[prefix_len] = 0;
            sprintf(str_no, "%d", ++compaction_no);
            strcat(nextfile, str_no);
        } while (does_file_exist(nextfile));
    } else {
        do {
            strcpy(nextfile, file);
            sprintf(str_no, ".%d", ++compaction_no);
            strcat(nextfile, str_no);
        } while (does_file_exist(nextfile));
    }
}